

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *max,int param_2,bool param_3)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  type_conflict5 tVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  double *pdVar11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar12;
  undefined7 in_register_00000009;
  long lVar13;
  long lVar14;
  undefined4 in_register_00000014;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint local_220;
  uint local_21c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  DataKey local_1d0;
  SPxId enterId;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> *local_178;
  long local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  long local_128;
  long local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])
                    (this,max,CONCAT44(in_register_00000014,param_2),
                     CONCAT71(in_register_00000009,param_3));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar9) + 0xa58) + 0x50));
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_00,iVar9) + 0xa60) + 0x50));
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_128 = **(long **)(CONCAT44(extraout_var_01,iVar9) + 0xa60);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar18 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar9) + 0xa60) + 0x70);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar17 = *(long *)(CONCAT44(extraout_var_03,iVar9) + 0xa60);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar14 = **(long **)(CONCAT44(extraout_var_04,iVar9) + 0xa80);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar2 = **(long **)(CONCAT44(extraout_var_05,iVar9) + 0xa78);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_120 = **(long **)(CONCAT44(extraout_var_06,iVar9) + 0xa58);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar3 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar9) + 0xa58) + 0x70);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar4 = *(long *)(CONCAT44(extraout_var_08,iVar9) + 0xa58);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar13 = **(long **)(CONCAT44(extraout_var_09,iVar9) + 0xa90);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar5 = **(long **)(CONCAT44(extraout_var_10,iVar9) + 0xa88);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var_11,iVar9));
  local_1b8.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_1b8.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_1b8.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_1b8.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_1b8.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_1b8.exp = (max->m_backend).exp;
  local_1b8.neg = (max->m_backend).neg;
  local_1b8.fpclass = (max->m_backend).fpclass;
  local_1b8.prec_elem = (max->m_backend).prec_elem;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.exp = 0;
  local_168.neg = false;
  y.m_backend.data._M_elems._0_8_ = (ulong)y.m_backend.data._M_elems[1] << 0x20;
  tVar7 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1b8,(int *)&y);
  local_178 = &(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend;
  local_220 = 0xffffffff;
  local_170 = lVar17;
  if (tVar7) {
    local_1d0.info = 0;
    local_1d0.idx = 0;
    for (lVar15 = 0; lVar15 < *(int *)(lVar17 + 0x58); lVar15 = lVar15 + 1) {
      iVar9 = *(int *)(*(long *)(lVar17 + 0x60) + lVar15 * 4);
      lVar16 = (long)iVar9 * 0x38;
      uVar6 = *(undefined8 *)(lVar18 + 0x20 + lVar16);
      local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar16);
      local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar16) + 2);
      puVar1 = (uint *)(lVar18 + 0x10 + lVar16);
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.exp = *(int *)(lVar18 + 0x28 + lVar16);
      local_168.neg = *(bool *)(lVar18 + 0x2c + lVar16);
      local_168._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar16);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&epsilon);
      if (tVar7) {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar11,(type *)0x0);
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar2 + lVar16),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar2 + lVar16),
                     (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_128));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,local_178);
LAB_0026ef4f:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems._24_5_ = 0;
          y.m_backend.data._M_elems[7]._1_3_ = 0;
          y.m_backend.data._M_elems._32_5_ = 0;
          y.m_backend.data._M_elems[9]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_168);
          tVar7 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8);
          lVar17 = local_170;
          if (tVar7) {
            iVar10 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            local_1d0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(extraout_var_12,iVar10),iVar9);
            local_1b8.data._M_elems[7]._1_3_ = y.m_backend.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems._24_5_ = y.m_backend.data._M_elems._24_5_;
            local_1b8.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_1b8.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_1b8.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_1b8.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_1b8.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_1b8.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_1b8.data._M_elems[9]._1_3_ = y.m_backend.data._M_elems[9]._1_3_;
            local_1b8.data._M_elems._32_5_ = y.m_backend.data._M_elems._32_5_;
            local_1b8.exp = y.m_backend.exp;
            local_1b8.neg = y.m_backend.neg;
            local_1b8.fpclass = y.m_backend.fpclass;
            local_1b8.prec_elem = y.m_backend.prec_elem;
            local_220 = (uint)lVar15;
            lVar17 = local_170;
            enterId.super_DataKey = local_1d0;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar6 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
        y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
        y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar6;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_168,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar11,(type *)0x0);
          tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar14 + lVar16),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar7) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar14 + lVar16),
                       (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_128));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&result.m_backend,local_178);
            goto LAB_0026ef4f;
          }
        }
      }
    }
    local_21c = 0xffffffff;
    for (lVar15 = 0; lVar15 < *(int *)(lVar4 + 0x58); lVar15 = lVar15 + 1) {
      iVar9 = *(int *)(*(long *)(lVar4 + 0x60) + lVar15 * 4);
      lVar16 = (long)iVar9 * 0x38;
      uVar6 = *(undefined8 *)(lVar3 + 0x20 + lVar16);
      local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar3 + lVar16);
      local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar3 + lVar16) + 2);
      puVar1 = (uint *)(lVar3 + 0x10 + lVar16);
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.exp = *(int *)(lVar3 + 0x28 + lVar16);
      local_168.neg = *(bool *)(lVar3 + 0x2c + lVar16);
      local_168._48_8_ = *(undefined8 *)(lVar3 + 0x30 + lVar16);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&epsilon);
      if (tVar7) {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar11,(type *)0x0);
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar5 + lVar16),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar5 + lVar16),
                     (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_120));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,local_178);
LAB_0026f2a9:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems._24_5_ = 0;
          y.m_backend.data._M_elems[7]._1_3_ = 0;
          y.m_backend.data._M_elems._32_5_ = 0;
          y.m_backend.data._M_elems[9]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_168);
          tVar7 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8);
          lVar17 = local_170;
          if (tVar7) {
            iVar10 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            local_1d0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_13,iVar10),iVar9);
            local_1b8.data._M_elems[7]._1_3_ = y.m_backend.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems._24_5_ = y.m_backend.data._M_elems._24_5_;
            local_1b8.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_1b8.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_1b8.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_1b8.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_1b8.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_1b8.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_1b8.data._M_elems[9]._1_3_ = y.m_backend.data._M_elems[9]._1_3_;
            local_1b8.data._M_elems._32_5_ = y.m_backend.data._M_elems._32_5_;
            local_1b8.exp = y.m_backend.exp;
            local_1b8.neg = y.m_backend.neg;
            local_1b8.fpclass = y.m_backend.fpclass;
            local_1b8.prec_elem = y.m_backend.prec_elem;
            local_21c = (uint)lVar15;
            lVar17 = local_170;
            enterId.super_DataKey = local_1d0;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar6 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
        y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
        y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar6;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_168,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar11,(type *)0x0);
          tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar13 + lVar16),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar7) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar13 + lVar16),
                       (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_120));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&result.m_backend,local_178);
            goto LAB_0026f2a9;
          }
        }
      }
    }
    if (-1 < (int)local_21c) {
      lVar18 = (long)*(int *)(*(long *)(lVar4 + 0x60) + (ulong)local_21c * 4) * 0x38;
      uVar6 = *(undefined8 *)(lVar3 + 0x20 + lVar18);
      local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar3 + lVar18);
      local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar3 + lVar18) + 2);
      puVar1 = (uint *)(lVar3 + 0x10 + lVar18);
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.exp = *(int *)(lVar3 + 0x28 + lVar18);
      local_168.neg = *(bool *)(lVar3 + 0x2c + lVar18);
      local_168._48_8_ = *(undefined8 *)(lVar3 + 0x30 + lVar18);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&epsilon);
      goto LAB_0026fb49;
    }
    if ((int)local_220 < 0) goto LAB_0026fd74;
    lVar17 = (long)*(int *)(*(long *)(lVar17 + 0x60) + (ulong)local_220 * 4) * 0x38;
    uVar6 = *(undefined8 *)(lVar18 + 0x20 + lVar17);
    local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar17);
    local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar17) + 2);
    puVar1 = (uint *)(lVar18 + 0x10 + lVar17);
    local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_168.exp = *(int *)(lVar18 + 0x28 + lVar17);
    local_168.neg = *(bool *)(lVar18 + 0x2c + lVar17);
    local_168._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar17);
    tVar7 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_168,&epsilon);
LAB_0026fc87:
    if (tVar7 != false) {
      lVar14 = lVar2;
    }
    local_1b8.data._M_elems._0_8_ = *(undefined8 *)(lVar14 + lVar17);
    local_1b8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar14 + lVar17) + 2);
    puVar1 = (uint *)(lVar14 + 0x10 + lVar17);
    local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1b8.data._M_elems._32_8_ = *(undefined8 *)(lVar14 + 0x20 + lVar17);
    local_1b8.exp = *(int *)(lVar14 + 0x28 + lVar17);
    local_1b8.neg = *(bool *)(lVar14 + 0x2c + lVar17);
    local_1b8._48_8_ = *(undefined8 *)(lVar14 + 0x30 + lVar17);
    v = (cpp_dec_float<50U,_int,_void> *)(local_128 + lVar17);
  }
  else {
    local_1d0.info = 0;
    local_1d0.idx = 0;
    lVar15 = 0;
    while( true ) {
      if (*(int *)(lVar17 + 0x58) <= lVar15) break;
      iVar9 = *(int *)(*(long *)(lVar17 + 0x60) + lVar15 * 4);
      lVar16 = (long)iVar9 * 0x38;
      uVar6 = *(undefined8 *)(lVar18 + 0x20 + lVar16);
      local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar16);
      local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar16) + 2);
      puVar1 = (uint *)(lVar18 + 0x10 + lVar16);
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.exp = *(int *)(lVar18 + 0x28 + lVar16);
      local_168.neg = *(bool *)(lVar18 + 0x2c + lVar16);
      local_168._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar16);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&epsilon);
      if (tVar7) {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,-*pdVar11,(type *)0x0);
        tVar7 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar14 + lVar16),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar14 + lVar16),
                     (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_128));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,local_178);
LAB_0026f66d:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems._24_5_ = 0;
          y.m_backend.data._M_elems[7]._1_3_ = 0;
          y.m_backend.data._M_elems._32_5_ = 0;
          y.m_backend.data._M_elems[9]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_168);
          tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8);
          lVar17 = local_170;
          if (tVar7) {
            iVar10 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            local_1d0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(extraout_var_14,iVar10),iVar9);
            local_1b8.data._M_elems[7]._1_3_ = y.m_backend.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems._24_5_ = y.m_backend.data._M_elems._24_5_;
            local_1b8.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_1b8.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_1b8.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_1b8.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_1b8.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_1b8.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_1b8.data._M_elems[9]._1_3_ = y.m_backend.data._M_elems[9]._1_3_;
            local_1b8.data._M_elems._32_5_ = y.m_backend.data._M_elems._32_5_;
            local_1b8.exp = y.m_backend.exp;
            local_1b8.neg = y.m_backend.neg;
            local_1b8.fpclass = y.m_backend.fpclass;
            local_1b8.prec_elem = y.m_backend.prec_elem;
            local_220 = (uint)lVar15;
            lVar17 = local_170;
            enterId.super_DataKey = local_1d0;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar6 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
        y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
        y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar6;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_168,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,*pdVar11,(type *)0x0);
          tVar7 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar2 + lVar16),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar7) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar2 + lVar16),
                       (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_128));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&result.m_backend,local_178);
            goto LAB_0026f66d;
          }
        }
      }
      lVar15 = lVar15 + 1;
    }
    local_21c = 0xffffffff;
    for (lVar15 = 0; lVar15 < *(int *)(lVar4 + 0x58); lVar15 = lVar15 + 1) {
      iVar9 = *(int *)(*(long *)(lVar4 + 0x60) + lVar15 * 4);
      lVar16 = (long)iVar9 * 0x38;
      uVar6 = *(undefined8 *)(lVar3 + 0x20 + lVar16);
      local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar3 + lVar16);
      local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar3 + lVar16) + 2);
      puVar1 = (uint *)(lVar3 + 0x10 + lVar16);
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.exp = *(int *)(lVar3 + 0x28 + lVar16);
      local_168.neg = *(bool *)(lVar3 + 0x2c + lVar16);
      local_168._48_8_ = *(undefined8 *)(lVar3 + 0x30 + lVar16);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&epsilon);
      if (tVar7) {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,-*pdVar11,(type *)0x0);
        tVar7 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar13 + lVar16),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar13 + lVar16),
                     (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_120));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,local_178);
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems._24_5_ = 0;
          y.m_backend.data._M_elems[7]._1_3_ = 0;
          y.m_backend.data._M_elems._32_5_ = 0;
          y.m_backend.data._M_elems[9]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_168);
          tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1b8);
          lVar17 = local_170;
          if (tVar7) {
LAB_0026f8cd:
            iVar10 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            local_1d0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_15,iVar10),iVar9);
            local_1b8.data._M_elems[7]._1_3_ = y.m_backend.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems._24_5_ = y.m_backend.data._M_elems._24_5_;
            local_1b8.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_1b8.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_1b8.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_1b8.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_1b8.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_1b8.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_1b8.data._M_elems[9]._1_3_ = y.m_backend.data._M_elems[9]._1_3_;
            local_1b8.data._M_elems._32_5_ = y.m_backend.data._M_elems._32_5_;
            local_1b8.exp = y.m_backend.exp;
            local_1b8.neg = y.m_backend.neg;
            local_1b8.fpclass = y.m_backend.fpclass;
            local_1b8.prec_elem = y.m_backend.prec_elem;
            local_21c = (uint)lVar15;
            lVar17 = local_170;
            enterId.super_DataKey = local_1d0;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar6 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
        y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
        y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar6;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_168,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar7) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,*pdVar11,(type *)0x0);
          tVar7 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar5 + lVar16),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar7) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar5 + lVar16),
                       (cpp_dec_float<50U,_int,_void> *)(lVar16 + local_120));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&result.m_backend,local_178);
            y.m_backend.fpclass = cpp_dec_float_finite;
            y.m_backend.prec_elem = 10;
            y.m_backend.data._M_elems[0] = 0;
            y.m_backend.data._M_elems[1] = 0;
            y.m_backend.data._M_elems[2] = 0;
            y.m_backend.data._M_elems[3] = 0;
            y.m_backend.data._M_elems[4] = 0;
            y.m_backend.data._M_elems[5] = 0;
            y.m_backend.data._M_elems._24_5_ = 0;
            y.m_backend.data._M_elems[7]._1_3_ = 0;
            y.m_backend.data._M_elems._32_5_ = 0;
            y.m_backend.data._M_elems[9]._1_3_ = 0;
            y.m_backend.exp = 0;
            y.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&y.m_backend,&result_1.m_backend,&local_168);
            tVar7 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&y.m_backend,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_1b8);
            lVar17 = local_170;
            if (tVar7) goto LAB_0026f8cd;
          }
        }
      }
    }
    if ((int)local_21c < 0) {
      if ((int)local_220 < 0) goto LAB_0026fd74;
      lVar17 = (long)*(int *)(*(long *)(lVar17 + 0x60) + (ulong)local_220 * 4) * 0x38;
      uVar6 = *(undefined8 *)(lVar18 + 0x20 + lVar17);
      local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar17);
      local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar17) + 2);
      puVar1 = (uint *)(lVar18 + 0x10 + lVar17);
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_168.exp = *(int *)(lVar18 + 0x28 + lVar17);
      local_168.neg = *(bool *)(lVar18 + 0x2c + lVar17);
      local_168._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar17);
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_168,&epsilon);
      goto LAB_0026fc87;
    }
    lVar18 = (long)*(int *)(*(long *)(lVar4 + 0x60) + (ulong)local_21c * 4) * 0x38;
    uVar6 = *(undefined8 *)(lVar3 + 0x20 + lVar18);
    local_168.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_168.data._M_elems._0_8_ = *(undefined8 *)(lVar3 + lVar18);
    local_168.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar3 + lVar18) + 2);
    puVar1 = (uint *)(lVar3 + 0x10 + lVar18);
    local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_168.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_168.exp = *(int *)(lVar3 + 0x28 + lVar18);
    local_168.neg = *(bool *)(lVar3 + 0x2c + lVar18);
    local_168._48_8_ = *(undefined8 *)(lVar3 + 0x30 + lVar18);
    tVar7 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_168,&epsilon);
LAB_0026fb49:
    if (tVar7 != false) {
      lVar13 = lVar5;
    }
    local_1b8.data._M_elems._0_8_ = *(undefined8 *)(lVar13 + lVar18);
    local_1b8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar13 + lVar18) + 2);
    puVar1 = (uint *)(lVar13 + 0x10 + lVar18);
    local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1b8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1b8.data._M_elems._32_8_ = *(undefined8 *)(lVar13 + 0x20 + lVar18);
    local_1b8.exp = *(int *)(lVar13 + 0x28 + lVar18);
    local_1b8.neg = *(bool *)(lVar13 + 0x2c + lVar18);
    local_1b8._48_8_ = *(undefined8 *)(lVar13 + 0x30 + lVar18);
    v = (cpp_dec_float<50U,_int,_void> *)(local_120 + lVar18);
  }
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems._24_5_ = 0;
  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&local_1b8,v);
  y.m_backend.fpclass = cpp_dec_float_finite;
  y.m_backend.prec_elem = 10;
  y.m_backend.data._M_elems[0] = 0;
  y.m_backend.data._M_elems[1] = 0;
  y.m_backend.data._M_elems[2] = 0;
  y.m_backend.data._M_elems[3] = 0;
  y.m_backend.data._M_elems[4] = 0;
  y.m_backend.data._M_elems[5] = 0;
  y.m_backend.data._M_elems._24_5_ = 0;
  y.m_backend.data._M_elems[7]._1_3_ = 0;
  y.m_backend.data._M_elems._32_5_ = 0;
  y.m_backend.data._M_elems[9]._1_3_ = 0;
  y.m_backend.exp = 0;
  y.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&y.m_backend,&result_1.m_backend,&local_168);
  local_1b8.data._M_elems[9]._1_3_ = y.m_backend.data._M_elems[9]._1_3_;
  local_1b8.data._M_elems._32_5_ = y.m_backend.data._M_elems._32_5_;
  local_1b8.data._M_elems[7]._1_3_ = y.m_backend.data._M_elems[7]._1_3_;
  local_1b8.data._M_elems._24_5_ = y.m_backend.data._M_elems._24_5_;
  local_1b8.data._M_elems[4] = y.m_backend.data._M_elems[4];
  local_1b8.data._M_elems[5] = y.m_backend.data._M_elems[5];
  local_1b8.data._M_elems[0] = y.m_backend.data._M_elems[0];
  local_1b8.data._M_elems[1] = y.m_backend.data._M_elems[1];
  local_1b8.data._M_elems[2] = y.m_backend.data._M_elems[2];
  local_1b8.data._M_elems[3] = y.m_backend.data._M_elems[3];
  local_1b8.exp = y.m_backend.exp;
  local_1b8.neg = y.m_backend.neg;
  local_1b8.fpclass = y.m_backend.fpclass;
  local_1b8.prec_elem = y.m_backend.prec_elem;
LAB_0026fd74:
  if (local_1d0.info != 0) {
    iVar9 = (*(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxRatioTester[3])();
    bVar8 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(extraout_var_16,iVar9),&enterId);
    if (bVar8) {
      lVar18 = 0xa58;
      if ((-1 < (int)local_21c) || (lVar18 = 0xa60, local_21c = local_220, -1 < (int)local_220)) {
        iVar9 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])();
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearNum((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(*(long *)(CONCAT44(extraout_var_17,iVar9) + lVar18) + 0x50),local_21c);
      }
      DVar12 = (DataKey)selectEnter(this,max,0,false);
      return (SPxId)DVar12;
    }
  }
  *(undefined8 *)((max->m_backend).data._M_elems + 8) = local_1b8.data._M_elems._32_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 4) = local_1b8.data._M_elems._16_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 6) = local_1b8.data._M_elems._24_8_;
  *(undefined8 *)(max->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
  (max->m_backend).exp = local_1b8.exp;
  (max->m_backend).neg = local_1b8.neg;
  (max->m_backend).fpclass = local_1b8.fpclass;
  (max->m_backend).prec_elem = local_1b8.prec_elem;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}